

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.h
# Opt level: O2

void __thiscall
cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_(uv_handle_ptr_base_<uv_timer_s> *this)

{
  std::__shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->handle).super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

~uv_handle_ptr_base_() { this->reset(); }